

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

StreamOut * initStreamOut(TidyDocImpl *doc,int encoding,uint nl)

{
  StreamOut *pSVar1;
  
  pSVar1 = (StreamOut *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
  pSVar1->nl = 0;
  pSVar1->iotype = FileIO;
  (pSVar1->sink).sinkData = (void *)0x0;
  (pSVar1->sink).putByte = (TidyPutByteFunc)0x0;
  pSVar1->encoding = encoding;
  pSVar1->state = FSM_ASCII;
  pSVar1->nl = nl;
  return pSVar1;
}

Assistant:

static StreamOut* initStreamOut( TidyDocImpl* doc, int encoding, uint nl )
{
    StreamOut* out = (StreamOut*) TidyDocAlloc( doc, sizeof(StreamOut) );
    TidyClearMemory( out, sizeof(StreamOut) );
    out->encoding = encoding;
    out->state = FSM_ASCII;
    out->nl = nl;
    return out;
}